

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::PackHalf2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,PackHalf2x16CaseInstance *this)

{
  uint uVar1;
  ShaderExecutor *pSVar2;
  Float<unsigned_short,_5,_10,_15,_3U> FVar3;
  Float<unsigned_short,_5,_10,_15,_3U> FVar4;
  deUint32 dVar5;
  deBool dVar6;
  deUint32 dVar7;
  Float<unsigned_int,_8,_23,_127,_3U> FVar8;
  Float<unsigned_int,_8,_23,_127,_3U> FVar9;
  int iVar10;
  int iVar11;
  float afVar12 [2];
  int ndx;
  int iVar13;
  int c;
  long lVar14;
  ostringstream *poVar15;
  deUint32 u32;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Vec2 v;
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_22a;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_228;
  ulong local_210;
  Hex<8UL> local_208;
  PackHalf2x16CaseInstance *local_200;
  TestStatus *local_1f8;
  uint local_1ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  ulong local_1d0;
  void *local_1c8;
  undefined1 local_1c0 [384];
  deRandom local_40;
  
  local_200 = this;
  local_1f8 = __return_storage_ptr__;
  dVar5 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar5 ^ 0x776002);
  local_228.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0._0_4_ = 0.0;
  local_1c0._4_4_ = 0.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_228,
             (Vector<float,_2> *)local_1c0);
  local_1c0._0_4_ = 0.5;
  local_1c0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_228,
             (Vector<float,_2> *)local_1c0);
  local_1c0._0_4_ = 1.0;
  local_1c0._4_4_ = 0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_228,
             (Vector<float,_2> *)local_1c0);
  local_1c0._0_4_ = -0.5;
  local_1c0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_228,
             (Vector<float,_2> *)local_1c0);
  local_1c0._0_4_ = 0.25;
  local_1c0._4_4_ = 0.75;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_228,
             (Vector<float,_2> *)local_1c0);
  iVar13 = 0;
  do {
    local_1c0._0_4_ = 0.0;
    local_1c0._4_4_ = 0.0;
    lVar14 = 0;
    do {
      dVar6 = deRandom_getBool(&local_40);
      dVar5 = deRandom_getUint32(&local_40);
      dVar7 = deRandom_getUint32(&local_40);
      iVar11 = (dVar5 / 0x1e) * -0x1f + dVar5 / 0x1e;
      *(uint *)(local_1c0 + lVar14 * 4) =
           (uint)(dVar6 != 1) << 0x1f |
           (dVar5 + iVar11 + -0xe + (uint)(iVar11 + dVar5 == 0xe)) * 0x800000 + 0x3f800000 |
           dVar7 & 0x7fffff;
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
              (&local_228,(value_type *)local_1c0);
    iVar13 = iVar13 + 1;
  } while (iVar13 != 0x5f);
  if (local_228.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_228.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    afVar12 = (float  [2])
              local_228.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_208.value = local_208.value & 0xffffffffffff0000;
      local_1c0._0_4_ = *(float *)afVar12;
      FVar3 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
      local_208.value._0_2_ = FVar3.m_value;
      FVar8 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_208);
      local_22a.m_value = 0;
      local_1c0._0_4_ = *(float *)((long)afVar12 + 4);
      local_22a = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                            ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
      FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_22a);
      *(StorageType *)afVar12 = FVar8.m_value;
      *(StorageType *)((long)afVar12 + 4) = FVar9.m_value;
      afVar12 = (float  [2])((long)afVar12 + 8);
    } while (afVar12 !=
             (float  [2])
             local_228.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1e8,
             (long)local_228.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_228.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_1c0._0_8_ = ((local_200->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar15 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar15);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar15,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar15);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
  local_1c0._0_8_ =
       local_228.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_208.value =
       (deUint64)
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  pSVar2 = (local_200->super_ShaderPackingFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  local_210 = 0;
  (*pSVar2->_vptr_ShaderExecutor[2])
            (pSVar2,(ulong)((long)local_228.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_228.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3,local_1c0,
             &local_208,0);
  local_1d0 = (ulong)((long)local_228.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_228.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)local_1d0) {
    lVar14 = 0;
    local_210 = 0;
    do {
      poVar15 = (ostringstream *)(local_1c0 + 8);
      local_1c0._0_4_ =
           *(float *)&((TestLog *)
                      ((long)local_228.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar14 * 8))->m_log;
      FVar3 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
      local_1c0._0_4_ =
           ((StorageType *)
           ((long)local_228.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4))[lVar14 * 2];
      FVar4 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)local_1c0);
      uVar1 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14];
      local_1c8 = (void *)(ulong)uVar1;
      local_1ec = (uint)FVar3.m_value;
      iVar11 = local_1ec - (uVar1 & 0xffff);
      iVar13 = -iVar11;
      if (0 < iVar11) {
        iVar13 = iVar11;
      }
      iVar10 = (uint)FVar4.m_value - (uVar1 >> 0x10);
      iVar11 = -iVar10;
      if (0 < iVar10) {
        iVar11 = iVar10;
      }
      if ((0 < iVar13) || (0 < iVar11)) {
        iVar10 = (int)local_210;
        if (iVar10 < 10) {
          local_1c0._0_8_ = ((local_200->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          poVar15 = (ostringstream *)(local_1c0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar15,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar15,(int)lVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar15,", expected packHalf2x16(",0x18);
          tcu::operator<<((ostream *)poVar15,
                          (Vector<float,_2> *)
                          (lVar14 * 8 +
                          (long)local_228.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_start));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,") = ",4);
          local_208.value = (deUint64)((uint)FVar4.m_value * 0x10000 + local_1ec);
          tcu::Format::Hex<8UL>::toStream(&local_208,(ostream *)poVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,", got ",6);
          local_208.value = (deUint64)local_1c8;
          tcu::Format::Hex<8UL>::toStream(&local_208,(ostream *)poVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,"\n  diffs = (",0xc)
          ;
          std::ostream::operator<<(poVar15,iVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,", ",2);
          std::ostream::operator<<(poVar15,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar15,"), max diff = ",0xe);
          std::ostream::operator<<(poVar15,0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar15);
          std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
          iVar10 = (int)local_210;
        }
        else if (iVar10 == 10) {
          local_1c0._0_8_ = ((local_200->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar15);
          std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
          iVar10 = (int)local_210;
        }
        local_210 = (ulong)(iVar10 + 1);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)((ulong)((long)local_228.
                                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_228.
                                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  local_1c0._0_8_ = ((local_200->super_ShaderPackingFunctionTestInstance).m_testCtx)->m_log;
  poVar15 = (ostringstream *)(local_1c0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar15);
  iVar13 = (int)local_1d0;
  std::ostream::operator<<(poVar15,iVar13 - (int)local_210);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15," / ",3);
  std::ostream::operator<<(poVar15,iVar13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar15," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar15);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x78));
  if ((int)local_210 == 0) {
    local_1c0._0_8_ = (long)local_1c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"Pass","");
    local_1f8->m_code = QP_TEST_RESULT_PASS;
    (local_1f8->m_description)._M_dataplus._M_p = (pointer)&(local_1f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8->m_description,local_1c0._0_8_,
               (undefined1 *)(local_1c0._8_8_ + local_1c0._0_8_));
  }
  else {
    local_1c0._0_8_ = (long)local_1c0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,"Result comparison failed","");
    local_1f8->m_code = QP_TEST_RESULT_FAIL;
    (local_1f8->m_description)._M_dataplus._M_p = (pointer)&(local_1f8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8->m_description,local_1c0._0_8_,
               (undefined1 *)(local_1c0._8_8_ + local_1c0._0_8_));
  }
  if (local_1c0._0_8_ != (long)local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((float  [2])
      local_228.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (float  [2])0x0) {
    operator_delete(local_228.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_1f8;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const int					maxDiff		= 0; // Values can be represented exactly in mediump.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values.
		{
			const int	minExp	= -14;
			const int	maxExp	= 15;

			for (int ndx = 0; ndx < 95; ndx++)
			{
				tcu::Vec2 v;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<23)-1);

					v[c] = tcu::Float32::construct(s, exp ? exp : 1 /* avoid denormals */, (1u<<23) | mantissa).asFloat();
				}
				inputs.push_back(v);
			}
		}

		// Convert input values to fp16 and back to make sure they can be represented exactly in mediump.
		for (std::vector<tcu::Vec2>::iterator inVal = inputs.begin(); inVal != inputs.end(); ++inVal)
			*inVal = tcu::Vec2(tcu::Float16(inVal->x()).asFloat(), tcu::Float16(inVal->y()).asFloat());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)tcu::Float16(inputs[valNdx].x()).bits();
				const deUint16	ref1	= (deUint16)tcu::Float16(inputs[valNdx].y()).bits();
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packHalf2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}